

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session.cpp
# Opt level: O0

void __thiscall anon_unknown.dwarf_1be885c::Impl::~Impl(Impl *this)

{
  bool bVar1;
  int in_ESI;
  Impl *this_local;
  
  (this->super_Session)._vptr_Session = (_func_int **)&PTR__Impl_01522f50;
  dap::Chan<std::function<void_()>_>::close(&this->inbox,in_ESI);
  dap::ContentReader::close(&this->reader,in_ESI);
  dap::ContentWriter::close(&this->writer,in_ESI);
  bVar1 = std::thread::joinable(&this->recvThread);
  if (bVar1) {
    std::thread::join();
  }
  bVar1 = std::thread::joinable(&this->dispatchThread);
  if (bVar1) {
    std::thread::join();
  }
  dap::Chan<std::function<void_()>_>::~Chan(&this->inbox);
  std::thread::~thread(&this->dispatchThread);
  std::thread::~thread(&this->recvThread);
  EventHandlers::~EventHandlers(&this->handlers);
  dap::ContentWriter::~ContentWriter(&this->writer);
  dap::ContentReader::~ContentReader(&this->reader);
  dap::Session::~Session(&this->super_Session);
  return;
}

Assistant:

~Impl() {
    inbox.close();
    reader.close();
    writer.close();
    if (recvThread.joinable()) {
      recvThread.join();
    }
    if (dispatchThread.joinable()) {
      dispatchThread.join();
    }
  }